

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::is_exclusive_sequence
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,size_type cur)

{
  bool bVar1;
  bool bVar2;
  const_reference prVar3;
  size_type sVar4;
  byte local_9b;
  undefined1 local_88 [3];
  bool canbe0length;
  range_pair local_6c [2];
  undefined1 local_58 [8];
  range_pairs nextchar_class;
  range_pairs curchar_class;
  state_type *curstate;
  size_type cur_local;
  re_compiler<char,_srell::u8regex_traits<char>_> *this_local;
  
  prVar3 = simple_array<srell::regex_internal::re_state>::operator[]
                     ((simple_array<srell::regex_internal::re_state> *)this,cur);
  range_pairs::range_pairs((range_pairs *)&nextchar_class.rparray_.capacity_);
  range_pairs::range_pairs((range_pairs *)local_58);
  if (prVar3->type == st_character) {
    range_pair_helper::range_pair_helper((range_pair_helper *)local_6c,(prVar3->field_0).character);
    range_pairs::join((range_pairs *)&nextchar_class.rparray_.capacity_,local_6c);
  }
  else {
    if (prVar3->type != st_character_class) {
      this_local._7_1_ = false;
      goto LAB_002f122f;
    }
    re_character_class::operator[]
              ((range_pairs *)local_88,
               &(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).character_class,
               (prVar3->field_0).number);
    range_pairs::operator=
              ((range_pairs *)&nextchar_class.rparray_.capacity_,(range_pairs *)local_88);
    range_pairs::~range_pairs((range_pairs *)local_88);
    sVar4 = range_pairs::size((range_pairs *)&nextchar_class.rparray_.capacity_);
    if (sVar4 == 0) {
      this_local._7_1_ = true;
      goto LAB_002f122f;
    }
  }
  bVar1 = gather_nextchars(this,(range_pairs *)local_58,cur + 1,0,true);
  sVar4 = range_pairs::size((range_pairs *)local_58);
  if ((sVar4 == 0) ||
     (bVar2 = range_pairs::is_overlap
                        ((range_pairs *)&nextchar_class.rparray_.capacity_,(range_pairs *)local_58),
     bVar2)) {
    sVar4 = range_pairs::size((range_pairs *)local_58);
    if ((sVar4 != 0) || ((bVar1 && (bVar1 = only_success_left(this,cur + 1), !bVar1)))) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = (bool)((prVar3->quantifier).field_2.is_greedy & 1);
    }
  }
  else {
    local_9b = 1;
    if (bVar1) {
      local_9b = (prVar3->quantifier).field_2.is_greedy;
    }
    this_local._7_1_ = (bool)(local_9b & 1);
  }
LAB_002f122f:
  range_pairs::~range_pairs((range_pairs *)local_58);
  range_pairs::~range_pairs((range_pairs *)&nextchar_class.rparray_.capacity_);
  return this_local._7_1_;
}

Assistant:

bool is_exclusive_sequence(const typename state_array::size_type cur) const
	{
		const state_type &curstate = this->NFA_states[cur];
		range_pairs curchar_class;
		range_pairs nextchar_class;

		if (curstate.type == st_character)
		{
			curchar_class.join(range_pair_helper(curstate.character));
		}
		else if (curstate.type == st_character_class)
		{
			curchar_class = this->character_class[curstate.number];
			if (curchar_class.size() == 0)	//  Means [], which always makes matching fail.
				return true;	//  For preventing the automaton from pushing bt data.
		}
		else
		{
			return false;
		}

		const bool canbe0length = gather_nextchars(nextchar_class, cur + 1, 0u, true);

		if (nextchar_class.size() && !curchar_class.is_overlap(nextchar_class))
		{
			return !canbe0length || curstate.quantifier.is_greedy;
		}
		else if (nextchar_class.size() == 0 && (!canbe0length || only_success_left(cur + 1)))
		{
			//  (size() == 0 && !canbe0length) means [].
			return curstate.quantifier.is_greedy;
		}

		return false;
	}